

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_set_bit(mbedtls_mpi *X,size_t pos,uchar val)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  if (1 < val) {
    return -4;
  }
  uVar3 = pos >> 6;
  if (X->n << 6 <= pos) {
    if (val == '\0') {
      return 0;
    }
    iVar1 = mbedtls_mpi_grow(X,uVar3 + 1);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  uVar2 = (uint)pos & 0x3f;
  X->p[uVar3] = (ulong)val << (sbyte)uVar2 | X->p[uVar3] & ~(1L << uVar2);
  return 0;
}

Assistant:

int mbedtls_mpi_set_bit( mbedtls_mpi *X, size_t pos, unsigned char val )
{
    int ret = 0;
    size_t off = pos / biL;
    size_t idx = pos % biL;

    if( val != 0 && val != 1 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( X->n * biL <= pos )
    {
        if( val == 0 )
            return( 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, off + 1 ) );
    }

    X->p[off] &= ~( (mbedtls_mpi_uint) 0x01 << idx );
    X->p[off] |= (mbedtls_mpi_uint) val << idx;

cleanup:

    return( ret );
}